

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::InsertTypeTransitionAfterInstr
          (BackwardPass *this,Instr *instr,int symId,AddPropertyCacheBucket *data,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  if (this->currentPrePassLoop == (Loop *)0x0) {
    if ((((instr->m_kind == InstrKindBranch) || (instr->m_kind == InstrKindExit)) ||
        (instr->m_opcode - 0x23 < 3)) || (instr->m_opcode - 0x173 < 2)) {
      InsertTypeTransitionsAtPriorSuccessors
                (this,this->currentBlock,(BasicBlock *)0x0,symId,data,upwardExposedUses);
    }
    else {
      InsertTypeTransition(this,instr->m_next,symId,data,upwardExposedUses);
    }
  }
  (data->finalType).t = (data->initialType).t;
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransitionAfterInstr(IR::Instr *instr, int symId, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    if (!this->IsPrePass())
    {
        // Transition to the final type if we don't bail out.
        if (instr->EndsBasicBlock())
        {
            // The instr with the bailout is something like a branch that may not fall through.
            // Insert the transitions instead at the beginning of each successor block.
            this->InsertTypeTransitionsAtPriorSuccessors(this->currentBlock, nullptr, symId, data, upwardExposedUses);
        }
        else
        {
            this->InsertTypeTransition(instr->m_next, symId, data, upwardExposedUses);
        }
    }
    // Note: we could probably clear this entry out of the table, but I don't know
    // whether it's worth it, because it's likely coming right back.
    data->SetFinalType(data->GetInitialType());
}